

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O3

void gen_local_scope_parser(void *context,fb_scope_t *scope)

{
  int iVar1;
  void *__src;
  size_t __n;
  dict_entry_t *__base;
  long *plVar2;
  undefined8 *__base_00;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  code *pcVar6;
  size_t sVar7;
  long lVar8;
  long *plVar9;
  undefined4 *puVar10;
  undefined8 *__dest;
  trie_t trie;
  fb_symbol_text_t scope_name;
  trie_t local_148;
  undefined8 local_118;
  undefined8 uStack_110;
  dict_entry_t *local_108;
  char local_f8 [208];
  
  local_148.dict = (dict_entry_t *)0x0;
  local_148.gen_match = (gen_match_f *)0x0;
  local_148.gen_unmatched = (gen_unmatched_f *)0x0;
  local_148.ct = (fb_compound_type_t *)0x0;
  local_148.type = 0;
  local_148.union_total = 0;
  local_148.label = 0;
  local_148._44_4_ = 0;
  __flatcc_fb_copy_scope(scope,local_f8);
  uStack_110 = *(undefined8 *)((long)context + 0xd8);
  local_118 = 0;
  local_108 = (dict_entry_t *)0x0;
  pcVar6 = count_visible_enum_symbol;
  fb_symbol_table_visit(&scope->symbol_index,count_visible_enum_symbol,&local_118);
  iVar3 = (int)local_118;
  if ((long)(int)local_118 == 0) {
    local_148.dict = (dict_entry_t *)0x0;
  }
  else {
    sVar7 = (long)(int)local_118 << 5;
    __base = (dict_entry_t *)malloc(sVar7);
    if (__base == (dict_entry_t *)0x0) {
      local_148.dict = (dict_entry_t *)0x0;
      if (0 < iVar3) {
        gen_local_scope_parser_cold_1();
        plVar9 = *(long **)(sVar7 + 0x28);
        if (plVar9 == (long *)0x0) {
          *(undefined4 *)pcVar6 = 0;
        }
        else {
          lVar8 = 0;
          sVar7 = 0;
          plVar2 = plVar9;
          do {
            if ((*(byte *)(plVar2 + 0xe) & 4) == 0) {
              if (((ushort)((short)(int)plVar2[5] - 0xfU) < 2) &&
                 (*(short *)(plVar2[3] + 0x10) == 4)) {
                sVar7 = sVar7 + 1;
                lVar8 = lVar8 + *(long *)(plVar2[1] + 8) + 6;
              }
              sVar7 = sVar7 + 1;
            }
            plVar2 = (long *)*plVar2;
          } while (plVar2 != (long *)0x0);
          *(int *)pcVar6 = (int)sVar7;
          if (sVar7 != 0) {
            __base_00 = (undefined8 *)malloc(lVar8 + sVar7 * 0x20);
            if (__base_00 != (undefined8 *)0x0) {
              if (plVar9 != (long *)0x0) {
                __dest = __base_00 + sVar7 * 4;
                lVar8 = 0;
                puVar4 = __base_00;
                do {
                  puVar5 = puVar4;
                  if ((*(byte *)(plVar9 + 0xe) & 4) == 0) {
                    puVar5 = (undefined8 *)plVar9[1];
                    __src = (void *)*puVar5;
                    *puVar4 = __src;
                    __n = puVar5[1];
                    iVar3 = (int)__n;
                    *(int *)(puVar4 + 1) = iVar3;
                    puVar4[2] = plVar9;
                    *(undefined4 *)(puVar4 + 3) = 0;
                    puVar5 = puVar4 + 4;
                    if (((ushort)((short)(int)plVar9[5] - 0xfU) < 2) &&
                       (*(short *)(plVar9[3] + 0x10) == 4)) {
                      plVar9[0x14] = lVar8;
                      lVar8 = lVar8 + 1;
                      *(int *)(puVar4 + 5) = iVar3 + 5;
                      puVar4[4] = __dest;
                      memcpy(__dest,__src,__n);
                      puVar10 = (undefined4 *)((long)__dest + *(long *)(plVar9[1] + 8));
                      __dest = (undefined8 *)((long)puVar10 + 6);
                      *(undefined2 *)(puVar10 + 1) = 0x65;
                      *puVar10 = 0x7079745f;
                      puVar4[6] = plVar9;
                      *(undefined4 *)(puVar4 + 7) = 1;
                      puVar5 = puVar4 + 8;
                    }
                  }
                  plVar9 = (long *)*plVar9;
                  puVar4 = puVar5;
                } while (plVar9 != (long *)0x0);
              }
              qsort(__base_00,sVar7,0x20,dict_cmp);
            }
          }
        }
        return;
      }
    }
    else {
      local_108 = __base;
      fb_symbol_table_visit(&scope->symbol_index,install_visible_enum_symbol,&local_118);
      qsort(__base,(long)(int)local_118,0x20,dict_cmp);
      local_148.dict = __base;
    }
  }
  local_148.ct = (fb_compound_type_t *)0x0;
  local_148.type = 3;
  local_148.gen_match = gen_scope_match;
  local_148.gen_unmatched = gen_scope_unmatched;
  println((fb_output_t *)context,
          "static const char *%s_local_%sjson_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
          ,*(undefined8 *)(*(long *)((long)context + 0xd8) + 0x110),local_f8);
  *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + 2;
  println((fb_output_t *)context,"int *value_type, uint64_t *value, int *aggregate)");
  iVar1 = *(int *)((long)context + 0xf0);
  if ((iVar1 != 0) && (*(int *)((long)context + 0xf0) = iVar1 + -1, iVar1 + -1 != 0)) {
    *(int *)((long)context + 0xf0) = iVar1 + -2;
    println((fb_output_t *)context,"{");
    *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + 1;
    if (iVar3 == 0) {
      println((fb_output_t *)context,"/* Scope has no enum / union types to look up. */");
      println((fb_output_t *)context,"return buf; /* unmatched; */");
      iVar3 = *(int *)((long)context + 0xf0);
      if (iVar3 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x4ba,"void gen_local_scope_parser(void *, fb_scope_t *)");
      }
    }
    else {
      println((fb_output_t *)context,"const char *unmatched = buf;");
      println((fb_output_t *)context,"const char *mark;");
      println((fb_output_t *)context,"uint64_t w;");
      println((fb_output_t *)context,"");
      println((fb_output_t *)context,"w = flatcc_json_parser_symbol_part(buf, end);");
      gen_trie((fb_output_t *)context,&local_148,0,iVar3 + -1,0);
      println((fb_output_t *)context,"return buf;");
      iVar3 = *(int *)((long)context + 0xf0);
      if (iVar3 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x4c3,"void gen_local_scope_parser(void *, fb_scope_t *)");
      }
    }
    *(int *)((long)context + 0xf0) = iVar3 + -1;
    println((fb_output_t *)context,"}");
    println((fb_output_t *)context,"");
    if (local_148.dict != (dict_entry_t *)0x0) {
      free(local_148.dict);
    }
    return;
  }
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x4b5,"void gen_local_scope_parser(void *, fb_scope_t *)");
}

Assistant:

static void gen_local_scope_parser(void *context, fb_scope_t *scope)
{
    fb_output_t *out = context;
    int n = 0;
    trie_t trie;
    fb_symbol_text_t scope_name;

    fb_clear(trie);
    fb_copy_scope(scope, scope_name);
    if (((trie.dict = build_local_scope_dict(out->S, scope, &n)) == 0) && n > 0) {
        gen_panic(out, "internal error: could not build dictionary for json parser\n");
        return;
    }
    /* Not used for scopes. */
    trie.ct = 0;
    trie.type = local_scope_trie;
    trie.gen_match = gen_scope_match;
    trie.gen_unmatched = gen_scope_unmatched;
    println(out, "static const char *%s_local_%sjson_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,",
        out->S->basename, scope_name);
    indent(); indent();
    println(out, "int *value_type, uint64_t *value, int *aggregate)");
    unindent(); unindent();
    println(out, "{"); indent();
    if (n == 0) {
        println(out, "/* Scope has no enum / union types to look up. */");
        println(out, "return buf; /* unmatched; */");
        unindent(); println(out, "}");
    } else {
        println(out, "const char *unmatched = buf;");
        println(out, "const char *mark;");
        println(out, "uint64_t w;");
        println(out, "");
        println(out, "w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out, &trie, 0, n - 1, 0);
        println(out, "return buf;");
        unindent(); println(out, "}");
    }
    println(out, "");
    clear_dict(trie.dict);
}